

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1_generate_luts.c
# Opt level: O1

int t1_init_spb(int f)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  
  bVar2 = ((f & 0x880U) == 0x80) + ((f & 0x220U) == 0x20);
  if (bVar2 != 0) {
    bVar2 = 1;
  }
  bVar3 = ((f & 0x880U) == 0x880) + ((f & 0x220U) == 0x220);
  bVar4 = ((f & 0x440U) == 0x40) + ((f & 0x110U) == 0x10);
  if (bVar4 != 0) {
    bVar4 = 1;
  }
  bVar5 = ((f & 0x440U) == 0x440) + ((f & 0x110U) == 0x110);
  if (((bool)bVar2 != (bVar3 != 0)) || (uVar1 = 0, (bool)bVar4 != (bVar5 != 0))) {
    uVar1 = (uint)((bVar4 <= bVar5 || (bool)bVar2 != (bVar3 != 0)) && bVar2 <= bVar3);
  }
  return uVar1;
}

Assistant:

static int t1_init_spb(int f) {
	int hc, vc, n;

	hc = opj_int_min(((f & (T1_SIG_E | T1_SGN_E)) ==
				T1_SIG_E) + ((f & (T1_SIG_W | T1_SGN_W)) == T1_SIG_W),
			1) - opj_int_min(((f & (T1_SIG_E | T1_SGN_E)) ==
					(T1_SIG_E | T1_SGN_E)) +
				((f & (T1_SIG_W | T1_SGN_W)) ==
				 (T1_SIG_W | T1_SGN_W)), 1);

	vc = opj_int_min(((f & (T1_SIG_N | T1_SGN_N)) ==
				T1_SIG_N) + ((f & (T1_SIG_S | T1_SGN_S)) == T1_SIG_S),
			1) - opj_int_min(((f & (T1_SIG_N | T1_SGN_N)) ==
					(T1_SIG_N | T1_SGN_N)) +
				((f & (T1_SIG_S | T1_SGN_S)) ==
				 (T1_SIG_S | T1_SGN_S)), 1);

	if (!hc && !vc)
		n = 0;
	else
		n = (!(hc > 0 || (!hc && vc > 0)));

	return n;
}